

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenReader.cpp
# Opt level: O1

int __thiscall ninx::parser::TokenReader::check_type(TokenReader *this,Type type)

{
  pointer puVar1;
  Type TVar2;
  uint uVar3;
  _Head_base<0UL,_ninx::lexer::token::Token_*,_false> _Var4;
  
  puVar1 = (this->tokens->
           super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(long)this->current_token <
      (ulong)((long)(this->tokens->
                    super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    _Var4._M_head_impl =
         *(Token **)
          &puVar1[this->current_token]._M_t.
           super___uniq_ptr_impl<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
    ;
  }
  else {
    _Var4._M_head_impl = (Token *)0x0;
  }
  if ((_Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
       )_Var4._M_head_impl == (Token *)0x0) {
    uVar3 = 0xffffffff;
  }
  else {
    TVar2 = (**(code **)(*(long *)_Var4._M_head_impl + 0x10))();
    uVar3 = (uint)(TVar2 == type);
  }
  return uVar3;
}

Assistant:

int ninx::parser::TokenReader::check_type(Type type) {
    auto token = peek_token();
    if (!token) {
        return -1;
    }

    return token->get_type() == type;
}